

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void __thiscall
LowererMD::EmitFloat32ToFloat64(LowererMD *this,Opnd *dst,Opnd *src,Instr *instrInsert)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Instr *instr;
  
  BVar4 = AutoSystemInfo::SSE2Available(&AutoSystemInfo::Data);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1bae,"(AutoSystemInfo::Data.SSE2Available())",
                       "AutoSystemInfo::Data.SSE2Available()");
    if (!bVar2) goto LAB_006681d6;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(dst);
  if ((OVar3 != OpndKindReg) || (dst->m_type != TyFloat64)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1bb0,"(dst->IsRegOpnd() && dst->IsFloat64())",
                       "dst->IsRegOpnd() && dst->IsFloat64()");
    if (!bVar2) goto LAB_006681d6;
    *puVar5 = 0;
  }
  OVar3 = IR::Opnd::GetKind(src);
  if ((OVar3 != OpndKindReg) || (src->m_type != TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1bb1,"(src->IsRegOpnd() && src->GetType() == TyFloat32)",
                       "src->IsRegOpnd() && src->GetType() == TyFloat32");
    if (!bVar2) {
LAB_006681d6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  instr = IR::Instr::New(CVTSS2SD,dst,src,this->m_func);
  IR::Instr::InsertBefore(instrInsert,instr);
  return;
}

Assistant:

void
LowererMD::EmitFloat32ToFloat64(IR::Opnd *dst, IR::Opnd *src, IR::Instr *instrInsert)
{
    // We should only generate this if sse2 is available
    Assert(AutoSystemInfo::Data.SSE2Available());

    Assert(dst->IsRegOpnd() && dst->IsFloat64());
    Assert(src->IsRegOpnd() && src->GetType() == TyFloat32);

    instrInsert->InsertBefore(IR::Instr::New(Js::OpCode::CVTSS2SD, dst, src, this->m_func));
}